

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AtomicCounterSimple::Run(AtomicCounterSimple *this)

{
  uint uVar1;
  GLuint GVar2;
  char *src_vs;
  char *src_fs;
  mapped_type *pmVar3;
  CallLogWrapper *this_00;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar4;
  bool local_2a39;
  bool local_29c9;
  _Self local_26b8;
  key_type local_26ac;
  _Self local_26a8;
  int local_26a0;
  allocator<char> local_2699;
  int i_1;
  _Base_ptr local_2678;
  undefined1 local_2670;
  allocator<char> local_2661;
  key_type local_2660;
  _Base_ptr local_2640;
  undefined1 local_2638;
  allocator<char> local_2629;
  key_type local_2628;
  GLint local_2608 [2];
  GLint param2 [1000];
  undefined1 local_1660 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp2;
  _Self local_1628;
  key_type local_161c;
  _Self local_1618;
  int local_1610;
  allocator<char> local_1609;
  int i;
  _Base_ptr local_15e8;
  undefined1 local_15e0;
  allocator<char> local_15d1;
  key_type local_15d0;
  _Base_ptr local_15b0;
  undefined1 local_15a8;
  allocator<char> local_1599;
  key_type local_1598;
  undefined1 local_1578 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp;
  GLint param [1000];
  GLenum prop2;
  undefined8 local_580;
  GLint expected3 [3];
  allocator<char> local_549;
  key_type local_548;
  undefined8 local_528;
  GLint expected2 [3];
  undefined8 local_4f8;
  GLenum props2 [3];
  undefined4 local_4c8;
  undefined4 local_4c4;
  GLint expected [4];
  allocator<char> local_4a9;
  key_type local_4a8;
  undefined8 uStack_488;
  GLenum props [4];
  key_type local_470;
  uint local_44c;
  uint local_448;
  GLint res;
  GLsizei length;
  GLsizei bufSize;
  GLenum prop;
  allocator<char> local_411;
  string local_410 [39];
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  key_type local_2d0;
  allocator<char> local_2a9;
  string local_2a8 [39];
  allocator<char> local_281;
  key_type local_280;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  key_type local_230;
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  key_type local_1e0;
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  key_type local_190;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  long error;
  string local_60 [32];
  string local_40 [36];
  GLuint local_1c;
  AtomicCounterSimple *pAStack_18;
  GLuint program;
  AtomicCounterSimple *this_local;
  
  pAStack_18 = this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(local_60);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_1c = GVar2;
  glu::CallLogWrapper::glBindAttribLocation(this_00,GVar2,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,local_1c,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,local_1c);
  indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_1c,0x92c0,0x92f5,3);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)local_1c,0x92c0,0x92f7,2,&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_a8);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"a",&local_c9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar2,0x92e1,local_a8,local_c8,
    &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"b",&local_f1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar2,0x92e1,local_a8,local_f0,
    &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"c",&local_119);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar2,0x92e1,local_a8,local_118,
    &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"d",&local_141);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar2,0x92e1,local_a8,local_140,
    &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"e",&local_169);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)GVar2,0x92e1,local_a8,local_168,
    &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"a",&local_191);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_190);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"a",&local_1b9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar2,0x92e1,(ulong)uVar1,local_1b8,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"b",&local_1e1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_1e0);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"b",&local_209);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar2,0x92e1,(ulong)uVar1,local_208,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"c",&local_231);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_230);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"c",&local_259);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar2,0x92e1,(ulong)uVar1,local_258,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"d",&local_281);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_280);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"d[0]",&local_2a9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar2,0x92e1,(ulong)uVar1,local_2a8,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"e",&local_2d1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_2d0);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"e",&local_2f9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)GVar2,0x92e1,(ulong)uVar1,local_2f8,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"a",&local_321);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,local_320,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_348,"b",&local_349);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,local_348,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"c",&local_371);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,local_370,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"d",&local_399);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,local_398,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"e",&local_3c1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,local_3c0,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"d[0]",&local_3e9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,local_3e8,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_410,"d[1]",&local_411);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,local_410,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prop,"d[2]",(allocator<char> *)((long)&bufSize + 3));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)GVar2,0x92e1,&prop,0xffffffff,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&prop);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bufSize + 3));
  GVar2 = local_1c;
  length = 0x9301;
  res = 1000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"a",(allocator<char> *)((long)props + 0xf));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_470);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)((long)props + 0xf));
  GVar2 = local_1c;
  uStack_488 = 0x930300009302;
  props[0] = 0x9304;
  props[1] = 0x9305;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"a",&local_4a9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_4a8);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  local_4c8 = 1;
  local_4c4 = 4;
  expected[0] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(props2 + 2),"a",(allocator<char> *)((long)props2 + 7));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,(key_type *)(props2 + 2));
  expected[1] = *pmVar3;
  std::__cxx11::string::~string((string *)(props2 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)props2 + 7));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)local_1c,0x92c0,(ulong)local_44c,4,&uStack_488,4,&local_4c8,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GVar2 = local_1c;
  local_4f8 = 0x930300009302;
  props2[0] = 0x9304;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected2 + 2),"b",(allocator<char> *)((long)expected2 + 7));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,(key_type *)(expected2 + 2));
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)(expected2 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected2 + 7));
  local_528 = 0x800000002;
  expected2[0] = 2;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)local_1c,0x92c0,(ulong)local_44c,3,&local_4f8,3,&local_528,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"c",&local_549);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_548);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)local_1c,0x92c0,(ulong)local_44c,3,&local_4f8,3,&local_528,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expected3 + 2),"d",(allocator<char> *)((long)expected3 + 7));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,(key_type *)(expected3 + 2));
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)(expected3 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)expected3 + 7));
  local_580 = 0x1000000005;
  expected3[0] = 2;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)local_1c,0x92c0,(ulong)local_44c,3,&local_4f8,3,&local_580,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prop2,"e",(allocator<char> *)((long)param + 3999));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,(key_type *)&prop2);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)&prop2);
  std::allocator<char>::~allocator((allocator<char> *)((long)param + 3999));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)local_1c,0x92c0,(ulong)local_44c,3,&local_4f8,3,&local_580,
            &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  param[0x3e6] = 0x9305;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_1578
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1598,"b",&local_1599);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_1598);
  pVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_1578,pmVar3);
  local_15b0 = (_Base_ptr)pVar4.first._M_node;
  local_15a8 = pVar4.second;
  std::__cxx11::string::~string((string *)&local_1598);
  std::allocator<char>::~allocator(&local_1599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_15d0,"c",&local_15d1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_15d0);
  pVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_1578,pmVar3);
  local_15e8 = (_Base_ptr)pVar4.first._M_node;
  local_15e0 = pVar4.second;
  std::__cxx11::string::~string((string *)&local_15d0);
  std::allocator<char>::~allocator(&local_15d1);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"b",&local_1609);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,(key_type *)&i);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_1609);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c,0x92c0,local_44c,1,(GLenum *)(param + 0x3e6),1000,
             (GLsizei *)&local_448,(GLint *)&exp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (local_1610 = 0; local_1610 < (int)local_448; local_1610 = local_1610 + 1) {
    local_161c = param[(long)local_1610 + -2];
    local_1618._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_1578,&local_161c);
    local_1628._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_1578);
    local_29c9 = std::operator==(&local_1618,&local_1628);
    local_29c9 = local_29c9 || local_448 != 2;
    if (local_29c9) {
      anon_unknown_0::Output("Length: %d\n",(ulong)local_448);
      anon_unknown_0::Output
                ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n",
                 (ulong)(uint)param[(long)local_1610 + -2]);
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_1c);
      this_local = (AtomicCounterSimple *)&DAT_ffffffffffffffff;
      exp2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      goto LAB_00f44e46;
    }
  }
  anon_unknown_0::Output("GL_ACTIVE_VARIABLES ok for 1st ATOMIC_COUNTER_BUFFER\n");
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_1660
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2628,"d",&local_2629);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_2628);
  pVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_1660,pmVar3);
  local_2640 = (_Base_ptr)pVar4.first._M_node;
  local_2638 = pVar4.second;
  std::__cxx11::string::~string((string *)&local_2628);
  std::allocator<char>::~allocator(&local_2629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2660,"e",&local_2661);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,&local_2660);
  pVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_1660,pmVar3);
  local_2678 = (_Base_ptr)pVar4.first._M_node;
  local_2670 = pVar4.second;
  std::__cxx11::string::~string((string *)&local_2660);
  std::allocator<char>::~allocator(&local_2661);
  GVar2 = local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,"d",&local_2699);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a8,(key_type *)&i_1);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e1,*pmVar3,1,(GLenum *)&length,1000,
             (GLsizei *)&local_448,(GLint *)&local_44c);
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator(&local_2699);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c,0x92c0,local_44c,1,(GLenum *)(param + 0x3e6),1000,
             (GLsizei *)&local_448,local_2608);
  local_26a0 = 0;
  do {
    if ((int)local_448 <= local_26a0) {
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_1c);
      this_local = (AtomicCounterSimple *)indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count;
LAB_00f44e2a:
      exp2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_1660);
LAB_00f44e46:
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_1578);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_a8);
      return (long)this_local;
    }
    local_26ac = param2[(long)local_26a0 + -2];
    local_26a8._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_1660,&local_26ac);
    local_26b8._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_1660);
    local_2a39 = std::operator==(&local_26a8,&local_26b8);
    local_2a39 = local_2a39 || local_448 != 2;
    if (local_2a39) {
      anon_unknown_0::Output("Length: %d\n",(ulong)local_448);
      anon_unknown_0::Output
                ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n",
                 (ulong)(uint)param2[(long)local_26a0 + -2]);
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_1c);
      this_local = (AtomicCounterSimple *)&DAT_ffffffffffffffff;
      goto LAB_00f44e2a;
    }
    local_26a0 = local_26a0 + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, 3, error);
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 2, error);

		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "a", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "d", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "e", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["c"], "c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["d"], "d[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["e"], "e", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "b", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "c", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "e", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[1]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[2]", -1, error);

		GLenum		  prop	= GL_ATOMIC_COUNTER_BUFFER_INDEX;
		const GLsizei bufSize = 1000;
		GLsizei		  length;
		GLint		  res;
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);

		GLenum props[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES, GL_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);
		GLint expected[] = { 1, 4, 1, static_cast<GLint>(indicesU["a"]) };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 4, props, 4, expected, error);

		GLenum props2[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		GLint expected2[] = { 2, 8, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["c"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);

		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		GLint expected3[] = { 5, 16, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["e"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);

		GLenum			 prop2 = GL_ACTIVE_VARIABLES;
		GLint			 param[bufSize];
		std::set<GLuint> exp;
		exp.insert(indicesU["b"]);
		exp.insert(indicesU["c"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param);
		for (int i = 0; i < length; ++i)
		{
			if (exp.find(param[i]) == exp.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}
		Output("GL_ACTIVE_VARIABLES ok for 1st ATOMIC_COUNTER_BUFFER\n");
		std::set<GLuint> exp2;
		GLint			 param2[bufSize];
		exp2.insert(indicesU["d"]);
		exp2.insert(indicesU["e"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param2);
		for (int i = 0; i < length; ++i)
		{
			if (exp2.find(param2[i]) == exp2.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param2[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}

		glDeleteProgram(program);
		return error;
	}